

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O0

IHEVCD_ERROR_T
ihevcd_profile_tier_level
          (bitstrm_t *ps_bitstrm,profile_tier_lvl_info_t *ps_ptl,WORD32 profile_present,
          WORD32 max_num_sub_layers)

{
  UWORD32 UVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  bitstrm_t *in_RDI;
  WORD32 i;
  IHEVCD_ERROR_T ret;
  WORD32 value;
  int local_2c;
  uint in_stack_ffffffffffffffdc;
  IHEVCD_ERROR_T local_4;
  
  local_4 = 0;
  if ((in_EDX == 0) ||
     (local_4 = ihevcd_parse_profile_tier_level_layer
                          ((bitstrm_t *)CONCAT44(in_EDX,in_ECX),
                           (profile_tier_lvl_t *)((ulong)in_stack_ffffffffffffffdc << 0x20)),
     local_4 == 0)) {
    UVar1 = ihevcd_bits_get(in_RDI,8);
    *(char *)(in_RSI + 0x30) = (char)UVar1;
    for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
      UVar1 = ihevcd_bits_get(in_RDI,1);
      *(char *)(in_RSI + 0x31 + (long)local_2c) = (char)UVar1;
      UVar1 = ihevcd_bits_get(in_RDI,1);
      *(char *)(in_RSI + 0x37 + (long)local_2c) = (char)UVar1;
    }
    local_2c = in_ECX;
    if (0 < in_ECX) {
      for (; local_2c < 8; local_2c = local_2c + 1) {
        UVar1 = ihevcd_bits_get(in_RDI,2);
      }
    }
    for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
      if (*(char *)(in_RSI + 0x31 + (long)local_2c) != '\0') {
        local_4 = ihevcd_parse_profile_tier_level_layer
                            ((bitstrm_t *)CONCAT44(in_EDX,in_ECX),
                             (profile_tier_lvl_t *)CONCAT44(UVar1,local_4));
      }
      if (*(char *)(in_RSI + 0x37 + (long)local_2c) != '\0') {
        UVar1 = ihevcd_bits_get(in_RDI,8);
        *(char *)(in_RSI + (long)local_2c * 0x31 + 0x6d) = (char)UVar1;
      }
    }
  }
  return local_4;
}

Assistant:

static IHEVCD_ERROR_T ihevcd_profile_tier_level(bitstrm_t *ps_bitstrm,
                                                profile_tier_lvl_info_t *ps_ptl,
                                                WORD32 profile_present,
                                                WORD32 max_num_sub_layers)
{
    WORD32 value;
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 i;

    if(profile_present)
    {
        ret = ihevcd_parse_profile_tier_level_layer(ps_bitstrm, &ps_ptl->s_ptl_gen);
        if((IHEVCD_ERROR_T)IHEVCD_SUCCESS != ret)
        {
            return ret;
        }
    }

    BITS_PARSE("general_level_idc", value, ps_bitstrm, 8);
    ps_ptl->s_ptl_gen.u1_level_idc = value;


    for(i = 0; i < max_num_sub_layers; i++)
    {
        BITS_PARSE("sub_layer_profile_present_flag[i]", value, ps_bitstrm, 1);
        ps_ptl->ai1_sub_layer_profile_present_flag[i] = value;

        BITS_PARSE("sub_layer_level_present_flag[i]", value, ps_bitstrm, 1);
        ps_ptl->ai1_sub_layer_level_present_flag[i] = value;
    }

    if(max_num_sub_layers > 0)
    {
        for(i = max_num_sub_layers; i < 8; i++)
        {
            BITS_PARSE("reserved_zero_2bits", value, ps_bitstrm, 2);
        }
    }

    for(i = 0; i < max_num_sub_layers; i++)
    {
        if(ps_ptl->ai1_sub_layer_profile_present_flag[i])
        {
            ret = ihevcd_parse_profile_tier_level_layer(ps_bitstrm,
                                                        &ps_ptl->as_ptl_sub[i]);
        }
        if(ps_ptl->ai1_sub_layer_level_present_flag[i])
        {
            BITS_PARSE("sub_layer_level_idc[i]", value, ps_bitstrm, 8);
            ps_ptl->as_ptl_sub[i].u1_level_idc = value;

        }
    }



    return ret;
}